

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

HelicsQuery helicsCreateQuery(char *target,char *query)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x80);
  (this->_M_dataplus)._M_p = (pointer)&this->field_2;
  this->_M_string_length = 0;
  (this->field_2)._M_local_buf[0] = '\0';
  this[1]._M_dataplus._M_p = (pointer)&this[1].field_2;
  this[1]._M_string_length = 0;
  this[1].field_2._M_local_buf[0] = '\0';
  this[2]._M_dataplus._M_p = (pointer)&this[2].field_2;
  this[2]._M_string_length = 0;
  this[2].field_2._M_local_buf[0] = '\0';
  *(undefined4 *)((long)&this[3].field_2 + 4) = 0;
  this[3]._M_dataplus._M_p = (pointer)0x0;
  this[3]._M_string_length = 0;
  this[3].field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&this[3].field_2 + 8) = 0xffffffff;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (query == (char *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
               gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
               gHelicsEmptyStr_abi_cxx11_._M_string_length);
  }
  else {
    sVar2 = strlen(query);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,query,query + sVar2);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this + 1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (target == (char *)0x0) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
               gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
               gHelicsEmptyStr_abi_cxx11_._M_string_length);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    sVar2 = strlen(target);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,target,target + sVar2);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined4 *)((long)&this[3].field_2 + 0xc) = 0x27063885;
  return this;
}

Assistant:

HelicsQuery helicsCreateQuery(const char* target, const char* query)
{
    auto* queryObj = new helics::QueryObject;
    queryObj->query = AS_STRING(query);
    queryObj->target = AS_STRING(target);
    queryObj->valid = validQueryIdentifier;
    return reinterpret_cast<void*>(queryObj);
}